

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  Parse *pPVar1;
  int *piVar2;
  Op *pOVar3;
  Op *pOVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = *pMaxFuncArgs;
  pPVar1 = p->pParse;
  piVar2 = pPVar1->aLabel;
  *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xfe7f | 0x80;
  pOVar3 = p->aOp + p->nOp;
  do {
    pOVar4 = pOVar3 + -1;
    if (0x53 < pOVar3[-1].opcode) goto LAB_0023cdf4;
    switch(pOVar3[-1].opcode) {
    case '\x02':
      if (pOVar3[-1].p2 != 0) {
        p->field_0xc1 = p->field_0xc1 & 0x7f;
      }
    case '\0':
    case '\x01':
      p->field_0xc2 = p->field_0xc2 | 1;
      break;
    case '\x03':
    case '\x05':
    case '\a':
      pOVar3[-1].p4.p = sqlite3BtreeNext;
      goto LAB_0023cda6;
    case '\x04':
    case '\x06':
      pOVar3[-1].p4.p = sqlite3BtreePrevious;
LAB_0023cda6:
      pOVar3[-1].p4type = -5;
      break;
    case '\b':
    case '\t':
    case '\n':
      *(ushort *)&p->field_0xc1 = *(ushort *)&p->field_0xc1 & 0xfe7f | 0x100;
      break;
    case '\v':
      iVar6 = pOVar3[-2].p1;
      goto LAB_0023cdb7;
    case '\f':
      iVar6 = pOVar3[-1].p2;
LAB_0023cdb7:
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
    }
    if (((""[pOVar4->opcode] & 1) != 0) && (pOVar3[-1].p2 < 0)) {
      pOVar3[-1].p2 = piVar2[(uint)~pOVar3[-1].p2];
    }
LAB_0023cdf4:
    pOVar3 = pOVar4;
    if (pOVar4 == p->aOp) {
      sqlite3DbFree(p->db,pPVar1->aLabel);
      pPVar1->aLabel = (int *)0x0;
      pPVar1->nLabel = 0;
      *pMaxFuncArgs = iVar5;
      return;
    }
  } while( true );
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  while(1){

    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* fall thru */
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          break;
        }
#endif
        case OP_Next:
        case OP_NextIfOpen:
        case OP_SorterNext: {
          pOp->p4.xAdvance = sqlite3BtreeNext;
          pOp->p4type = P4_ADVANCE;
          break;
        }
        case OP_Prev:
        case OP_PrevIfOpen: {
          pOp->p4.xAdvance = sqlite3BtreePrevious;
          pOp->p4type = P4_ADVANCE;
          break;
        }
      }
      if( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 && pOp->p2<0 ){
        assert( ADDR(pOp->p2)<pParse->nLabel );
        pOp->p2 = aLabel[ADDR(pOp->p2)];
      }
    }
    if( pOp==p->aOp ) break;
    pOp--;
  }
  sqlite3DbFree(p->db, pParse->aLabel);
  pParse->aLabel = 0;
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}